

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

_Bool ConnectionExists(Curl_easy *data,connectdata *needle,connectdata **usethis,_Bool *force_reuse,
                      _Bool *waitpipe)

{
  _Bool _Var1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  url_conn_match match;
  connectdata *local_58;
  Curl_easy *pCStack_50;
  connectdata *local_48;
  undefined8 uStack_40;
  
  local_58 = (connectdata *)0x0;
  uStack_40 = 0;
  pCStack_50 = data;
  local_48 = needle;
  if (((needle->handler->protocol & 0xc0000003) != 0) && ((~*(uint *)&needle->bits & 0x2020) != 0))
  {
    _Var1 = Curl_multiplex_wanted(data->multi);
    if ((_Var1) && (bVar2 = 1, ((data->state).http_neg.allowed & 6) != 0)) goto LAB_00165c7e;
  }
  bVar2 = 0;
LAB_00165c7e:
  if (((data->state).authhost.want & 8) == 0) {
    bVar3 = 0;
  }
  else {
    bVar3 = ((needle->handler->protocol & 0xc0000003) != 0) * '\x02';
  }
  if ((((ulong)needle->bits & 4) == 0) || (((data->state).authproxy.want & 8) == 0)) {
    bVar4 = 0;
  }
  else {
    bVar4 = ((needle->handler->protocol & 0xc0000003) != 0) << 2;
  }
  uStack_40 = CONCAT71((int7)((ulong)uStack_40 >> 8),(byte)uStack_40 & 0xf8 | bVar2 | bVar3 | bVar4)
  ;
  _Var1 = Curl_cpool_find(data,needle->destination,url_match_conn,url_match_result,&local_58);
  *usethis = local_58;
  *force_reuse = (_Bool)((byte)uStack_40 >> 4 & 1);
  *waitpipe = (_Bool)((byte)uStack_40 >> 3 & 1);
  return _Var1;
}

Assistant:

static bool
ConnectionExists(struct Curl_easy *data,
                 struct connectdata *needle,
                 struct connectdata **usethis,
                 bool *force_reuse,
                 bool *waitpipe)
{
  struct url_conn_match match;
  bool result;

  memset(&match, 0, sizeof(match));
  match.data = data;
  match.needle = needle;
  match.may_multiplex = xfer_may_multiplex(data, needle);

#ifdef USE_NTLM
  match.want_ntlm_http = ((data->state.authhost.want & CURLAUTH_NTLM) &&
                          (needle->handler->protocol & PROTO_FAMILY_HTTP));
#ifndef CURL_DISABLE_PROXY
  match.want_proxy_ntlm_http =
    (needle->bits.proxy_user_passwd &&
     (data->state.authproxy.want & CURLAUTH_NTLM) &&
     (needle->handler->protocol & PROTO_FAMILY_HTTP));
#endif
#endif

  /* Find a connection in the pool that matches what "data + needle"
   * requires. If a suitable candidate is found, it is attached to "data". */
  result = Curl_cpool_find(data, needle->destination,
                           url_match_conn, url_match_result, &match);

  /* wait_pipe is TRUE if we encounter a bundle that is undecided. There
   * is no matching connection then, yet. */
  *usethis = match.found;
  *force_reuse = match.force_reuse;
  *waitpipe = match.wait_pipe;
  return result;
}